

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvnc.cpp
# Opt level: O0

void __thiscall
QVncClientCursor::changeCursor(QVncClientCursor *this,QCursor *widgetCursor,QWindow *window)

{
  bool bVar1;
  int hotX;
  QImage *pQVar2;
  const_iterator o;
  long in_RSI;
  QImage *in_RDI;
  long in_FS_OFFSET;
  QVncClient *client;
  add_const_t<QList<QVncClient_*>_> *__range1;
  CursorShape shape;
  const_iterator __end1;
  const_iterator __begin1;
  QPlatformCursorImage platformImage;
  undefined4 in_stack_ffffffffffffff40;
  uchar *in_stack_ffffffffffffff50;
  uchar *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  const_iterator local_70;
  QPoint local_68;
  QPlatformCursorImage local_60;
  QPixmap local_40 [24];
  QImage local_28 [24];
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == 0) {
    hotX = 0;
  }
  else {
    hotX = QCursor::shape();
  }
  if (hotX == 0x18) {
    local_10 = QCursor::hotSpot();
    *(undefined8 *)(in_RDI + 0x28) = local_10;
    QCursor::pixmap();
    QPixmap::toImage();
    QImage::operator=(in_RDI,(QImage *)CONCAT44(hotX,in_stack_ffffffffffffff40));
    QImage::~QImage(local_28);
    QPixmap::~QPixmap(local_40);
  }
  else {
    local_60.cursorImage = (QImage)0xaa;
    local_60._1_7_ = 0xaaaaaaaaaaaaaa;
    local_60._8_8_ = 0xaaaaaaaaaaaaaaaa;
    local_60._16_8_ = 0xaaaaaaaaaaaaaaaa;
    local_60.hot.xp.m_i = -0x55555556;
    local_60.hot.yp.m_i = -0x55555556;
    QPlatformCursorImage::QPlatformCursorImage
              ((QPlatformCursorImage *)CONCAT44(hotX,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,(int)((ulong)in_RDI >> 0x20),
               (int)in_RDI,hotX,(int)in_RSI);
    QPlatformCursorImage::set((CursorShape)&local_60);
    pQVar2 = QPlatformCursorImage::image(&local_60);
    QImage::operator=(in_RDI + 0x10,(QImage *)pQVar2);
    local_68 = QPlatformCursorImage::hotspot
                         ((QPlatformCursorImage *)CONCAT44(hotX,in_stack_ffffffffffffff40));
    *(QPoint *)(in_RDI + 0x28) = local_68;
    QPlatformCursorImage::~QPlatformCursorImage((QPlatformCursorImage *)0x10e1a1);
  }
  local_70.i = (QVncClient **)0xaaaaaaaaaaaaaaaa;
  local_70 = QList<QVncClient_*>::begin
                       ((QList<QVncClient_*> *)CONCAT44(hotX,in_stack_ffffffffffffff40));
  o = QList<QVncClient_*>::end((QList<QVncClient_*> *)CONCAT44(hotX,in_stack_ffffffffffffff40));
  while( true ) {
    bVar1 = QList<QVncClient_*>::const_iterator::operator!=(&local_70,o);
    if (!bVar1) break;
    QList<QVncClient_*>::const_iterator::operator*(&local_70);
    QVncClient::setDirtyCursor((QVncClient *)0x10e22f);
    QList<QVncClient_*>::const_iterator::operator++(&local_70);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QVncClientCursor::changeCursor(QCursor *widgetCursor, QWindow *window)
{
    Q_UNUSED(window);
    const Qt::CursorShape shape = widgetCursor ? widgetCursor->shape() : Qt::ArrowCursor;

    if (shape == Qt::BitmapCursor) {
        // application supplied cursor
        hotspot = widgetCursor->hotSpot();
        cursor = widgetCursor->pixmap().toImage();
    } else {
        // system cursor
        QPlatformCursorImage platformImage(nullptr, nullptr, 0, 0, 0, 0);
        platformImage.set(shape);
        cursor = *platformImage.image();
        hotspot = platformImage.hotspot();
    }
    for (auto client : std::as_const(clients))
        client->setDirtyCursor();
}